

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getEnterVals(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxId enterId,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterTest,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterUB,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *enterLB,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterVal,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterMax,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterPric,Status *enterStat,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterRO,StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *objChange)

{
  uint *puVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  undefined4 uVar4;
  pointer pnVar5;
  undefined8 uVar6;
  pointer pnVar7;
  undefined4 uVar8;
  Real RVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  int iVar18;
  Status SVar19;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar20;
  double *pdVar21;
  cpp_dec_float<50U,_int,_void> *pcVar22;
  Status *pSVar23;
  undefined8 *puVar24;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar25;
  long lVar26;
  cpp_dec_float<50U,_int,_void> *pcVar27;
  cpp_dec_float<50U,_int,_void> *pcVar28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar29;
  cpp_dec_float<50u,int,void> *pcVar30;
  undefined4 uVar31;
  uint uVar32;
  undefined4 uVar33;
  cpp_dec_float<50U,_int,_void> local_3e8;
  cpp_dec_float<50U,_int,_void> *local_3b0;
  long local_3a8;
  cpp_dec_float<50U,_int,_void> *local_3a0;
  undefined8 local_398;
  undefined4 uStack_390;
  uint uStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  DataKey local_370;
  cpp_dec_float<50U,_int,_void> local_368;
  cpp_dec_float<50u,int,void> local_328 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  cpp_dec_float<50u,int,void> local_268 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  cpp_dec_float<50u,int,void> local_1a8 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  cpp_dec_float<50u,int,void> local_e8 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_3b0 = &enterLB->m_backend;
  local_3a0 = &enterVal->m_backend;
  local_398 = &enterUB->m_backend;
  local_370 = enterId.super_DataKey;
  if (enterId.super_DataKey.info < 1) {
    SPxRowId::SPxRowId((SPxRowId *)&local_3e8,(SPxId *)&local_370);
    iVar18 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set,(DataKey *)&local_3e8);
    lVar26 = (long)iVar18;
    *enterStat = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.rowstat.data[lVar26];
    if (this->theRep == ROW) {
      computePvec((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_3e8,this,iVar18);
      computeTest((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_3e8,this,iVar18);
      *(ulong *)((enterTest->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterTest->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(undefined8 *)(enterTest->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      (enterTest->m_backend).exp = local_3e8.exp;
      (enterTest->m_backend).neg = local_3e8.neg;
      (enterTest->m_backend).fpclass = local_3e8.fpclass;
      (enterTest->m_backend).prec_elem = local_3e8.prec_elem;
      pVVar20 = &this->theTest;
    }
    else {
      pVVar20 = &this->theCoTest;
      pnVar5 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterTest->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = uVar13;
      (enterTest->m_backend).exp = pnVar5[lVar26].m_backend.exp;
      (enterTest->m_backend).neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterTest->m_backend).fpclass = pnVar5[lVar26].m_backend.fpclass;
      (enterTest->m_backend).prec_elem = iVar3;
    }
    local_3a8 = lVar26;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(pVVar20->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend,0);
    switch(*enterStat) {
    case D_FREE:
      ::soplex::infinity::__tls_init();
      pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_388 = *pdVar21;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      uStack_380 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(local_398->data)._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((local_398->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((local_398->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((local_398->data)._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((local_398->data)._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      local_398->exp = local_3e8.exp;
      local_398->neg = local_3e8.neg;
      local_398->fpclass = local_3e8.fpclass;
      local_398->prec_elem = local_3e8.prec_elem;
      ::soplex::infinity::__tls_init();
      uStack_38c = uStack_380._4_4_ ^ 0x80000000;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      local_398 = (cpp_dec_float<50U,_int,_void> *)-local_388;
      uStack_390 = (undefined4)uStack_380;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,-local_388);
      *(undefined8 *)(local_3b0->data)._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((local_3b0->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((local_3b0->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((local_3b0->data)._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((local_3b0->data)._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      local_3b0->exp = local_3e8.exp;
      local_3b0->neg = local_3e8.neg;
      local_3b0->fpclass = local_3e8.fpclass;
      local_3b0->prec_elem = local_3e8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(local_3a0,0);
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar13 = *(undefined8 *)puVar1;
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)(enterRO->m_backend).data._M_elems =
           *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar13;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      (enterRO->m_backend).exp = pnVar5[lVar26].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[lVar26].m_backend.neg;
      uVar4 = pnVar5[lVar26].m_backend.fpclass;
      uVar8 = pnVar5[lVar26].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = uVar4;
      (enterRO->m_backend).prec_elem = uVar8;
      if ((((enterPric->m_backend).fpclass == cpp_dec_float_NaN) || (uVar4 == 2)) ||
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&enterPric->m_backend,&enterRO->m_backend), iVar18 < 1)) {
        uStack_380 = CONCAT44(uStack_38c,uStack_390);
        local_388 = (double)local_398;
      }
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pSVar23 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_002672b3;
    case D_ON_UPPER:
      pnVar7 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_398->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar7[lVar26].m_backend.data + 0x20);
      pnVar5 = pnVar7 + lVar26;
      uVar32 = (pnVar5->m_backend).data._M_elems[0];
      uVar10 = *(uint *)((long)&(pnVar5->m_backend).data + 4);
      uVar11 = *(uint *)((long)&(pnVar5->m_backend).data + 8);
      uVar12 = *(uint *)((long)&(pnVar5->m_backend).data + 0xc);
      puVar1 = (uint *)((long)&pnVar7[lVar26].m_backend.data + 0x10);
      uVar6 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_398->data)._M_elems + 6) = uVar6;
      (local_398->data)._M_elems[0] = uVar32;
      (local_398->data)._M_elems[1] = uVar10;
      (local_398->data)._M_elems[2] = uVar11;
      (local_398->data)._M_elems[3] = uVar12;
      local_398->exp = pnVar7[lVar26].m_backend.exp;
      local_398->neg = pnVar7[lVar26].m_backend.neg;
      iVar3 = pnVar7[lVar26].m_backend.prec_elem;
      local_398->fpclass = pnVar7[lVar26].m_backend.fpclass;
      local_398->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      local_388 = -*pdVar21;
      uStack_380 = 0x8000000000000000;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,-*pdVar21);
      *(undefined8 *)(local_3b0->data)._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((local_3b0->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((local_3b0->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((local_3b0->data)._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((local_3b0->data)._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      local_3b0->exp = local_3e8.exp;
      local_3b0->neg = local_3e8.neg;
      local_3b0->fpclass = local_3e8.fpclass;
      local_3b0->prec_elem = local_3e8.prec_elem;
      *(undefined8 *)((local_3a0->data)._M_elems + 8) =
           *(undefined8 *)((local_398->data)._M_elems + 8);
      uVar6 = *(undefined8 *)(local_398->data)._M_elems;
      uVar13 = *(undefined8 *)((local_398->data)._M_elems + 2);
      uVar14 = *(undefined8 *)((local_398->data)._M_elems + 6);
      *(undefined8 *)((local_3a0->data)._M_elems + 4) =
           *(undefined8 *)((local_398->data)._M_elems + 4);
      *(undefined8 *)((local_3a0->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_3a0->data)._M_elems = uVar6;
      *(undefined8 *)((local_3a0->data)._M_elems + 2) = uVar13;
      local_3a0->exp = local_398->exp;
      local_3a0->neg = local_398->neg;
      iVar3 = local_398->prec_elem;
      local_3a0->fpclass = local_398->fpclass;
      local_3a0->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar13;
      iVar18 = pnVar5[lVar26].m_backend.exp;
      (enterRO->m_backend).exp = iVar18;
      bVar17 = pnVar5[lVar26].m_backend.neg;
      (enterRO->m_backend).neg = bVar17;
      fVar2 = pnVar5[lVar26].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar22 = &enterRO->m_backend;
      if ((&local_3e8 != local_3a0) && (pcVar22 = local_3a0, &local_3e8 != &enterRO->m_backend)) {
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.prec_elem = iVar3;
        local_3e8.fpclass = fVar2;
        local_3e8.exp = iVar18;
        local_3e8.neg = bVar17;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar22)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      pSVar23 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_00267811;
    case D_ON_LOWER:
      pnVar7 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_3b0->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar7[lVar26].m_backend.data + 0x20);
      pnVar5 = pnVar7 + lVar26;
      uVar32 = (pnVar5->m_backend).data._M_elems[0];
      uVar10 = *(uint *)((long)&(pnVar5->m_backend).data + 4);
      uVar11 = *(uint *)((long)&(pnVar5->m_backend).data + 8);
      uVar12 = *(uint *)((long)&(pnVar5->m_backend).data + 0xc);
      puVar1 = (uint *)((long)&pnVar7[lVar26].m_backend.data + 0x10);
      uVar6 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_3b0->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_3b0->data)._M_elems + 6) = uVar6;
      (local_3b0->data)._M_elems[0] = uVar32;
      (local_3b0->data)._M_elems[1] = uVar10;
      (local_3b0->data)._M_elems[2] = uVar11;
      (local_3b0->data)._M_elems[3] = uVar12;
      local_3b0->exp = pnVar7[lVar26].m_backend.exp;
      local_3b0->neg = pnVar7[lVar26].m_backend.neg;
      iVar3 = pnVar7[lVar26].m_backend.prec_elem;
      local_3b0->fpclass = pnVar7[lVar26].m_backend.fpclass;
      local_3b0->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_388 = *pdVar21;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(local_398->data)._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((local_398->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((local_398->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((local_398->data)._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((local_398->data)._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      local_398->exp = local_3e8.exp;
      local_398->neg = local_3e8.neg;
      local_398->fpclass = local_3e8.fpclass;
      local_398->prec_elem = local_3e8.prec_elem;
      *(undefined8 *)((local_3a0->data)._M_elems + 8) =
           *(undefined8 *)((local_3b0->data)._M_elems + 8);
      uVar6 = *(undefined8 *)(local_3b0->data)._M_elems;
      uVar13 = *(undefined8 *)((local_3b0->data)._M_elems + 2);
      uVar14 = *(undefined8 *)((local_3b0->data)._M_elems + 6);
      *(undefined8 *)((local_3a0->data)._M_elems + 4) =
           *(undefined8 *)((local_3b0->data)._M_elems + 4);
      *(undefined8 *)((local_3a0->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_3a0->data)._M_elems = uVar6;
      *(undefined8 *)((local_3a0->data)._M_elems + 2) = uVar13;
      local_3a0->exp = local_3b0->exp;
      local_3a0->neg = local_3b0->neg;
      iVar3 = local_3b0->prec_elem;
      local_3a0->fpclass = local_3b0->fpclass;
      local_3a0->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar13;
      iVar18 = pnVar5[lVar26].m_backend.exp;
      (enterRO->m_backend).exp = iVar18;
      bVar17 = pnVar5[lVar26].m_backend.neg;
      (enterRO->m_backend).neg = bVar17;
      fVar2 = pnVar5[lVar26].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar22 = &enterRO->m_backend;
      if ((&local_3e8 != local_3a0) && (pcVar22 = local_3a0, &local_3e8 != &enterRO->m_backend)) {
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.prec_elem = iVar3;
        local_3e8.fpclass = fVar2;
        local_3e8.exp = iVar18;
        local_3e8.neg = bVar17;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar22)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      pSVar23 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_00267737;
    case D_ON_BOTH:
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      if ((((int)uVar6 == 2) ||
          (pnVar5 = (this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pnVar5[lVar26].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&enterPric->m_backend,&pnVar5[lVar26].m_backend), iVar18 < 1)) {
        pnVar7 = (this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)((long)&pnVar7[lVar26].m_backend.data + 0x20);
        *(undefined8 *)((local_398->data)._M_elems + 8) = uVar6;
        pnVar5 = pnVar7 + lVar26;
        uVar32 = (pnVar5->m_backend).data._M_elems[0];
        uVar10 = *(uint *)((long)&(pnVar5->m_backend).data + 4);
        uVar11 = *(uint *)((long)&(pnVar5->m_backend).data + 8);
        uVar12 = *(uint *)((long)&(pnVar5->m_backend).data + 0xc);
        puVar1 = (uint *)((long)&pnVar7[lVar26].m_backend.data + 0x10);
        uVar13 = *(undefined8 *)puVar1;
        uVar14 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((local_398->data)._M_elems + 4) = uVar13;
        *(undefined8 *)((local_398->data)._M_elems + 6) = uVar14;
        (local_398->data)._M_elems[0] = uVar32;
        (local_398->data)._M_elems[1] = uVar10;
        (local_398->data)._M_elems[2] = uVar11;
        (local_398->data)._M_elems[3] = uVar12;
        local_398->exp = pnVar7[lVar26].m_backend.exp;
        local_398->neg = pnVar7[lVar26].m_backend.neg;
        iVar3 = pnVar7[lVar26].m_backend.prec_elem;
        local_398->fpclass = pnVar7[lVar26].m_backend.fpclass;
        local_398->prec_elem = iVar3;
        *(undefined8 *)((local_3a0->data)._M_elems + 8) = uVar6;
        *(undefined8 *)((local_3a0->data)._M_elems + 4) = uVar13;
        *(undefined8 *)((local_3a0->data)._M_elems + 6) = uVar14;
        (local_3a0->data)._M_elems[0] = uVar32;
        (local_3a0->data)._M_elems[1] = uVar10;
        (local_3a0->data)._M_elems[2] = uVar11;
        (local_3a0->data)._M_elems[3] = uVar12;
        local_3a0->exp = local_398->exp;
        local_3a0->neg = local_398->neg;
        iVar3 = local_398->prec_elem;
        local_3a0->fpclass = local_398->fpclass;
        local_3a0->prec_elem = iVar3;
        ::soplex::infinity::__tls_init();
        pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 10;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems._24_5_ = 0;
        local_3e8.data._M_elems[7]._1_3_ = 0;
        local_3e8.data._M_elems._32_5_ = 0;
        local_3e8.data._M_elems[9]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        local_398 = (cpp_dec_float<50U,_int,_void> *)((ulong)*pdVar21 ^ 0x8000000000000000);
        uStack_390 = 0;
        uStack_38c = 0x80000000;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,-*pdVar21);
        *(undefined8 *)(local_3b0->data)._M_elems = local_3e8.data._M_elems._0_8_;
        *(undefined8 *)((local_3b0->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
        *(undefined8 *)((local_3b0->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
        *(ulong *)((local_3b0->data)._M_elems + 6) =
             CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
        *(ulong *)((local_3b0->data)._M_elems + 8) =
             CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
        local_3b0->exp = local_3e8.exp;
        local_3b0->neg = local_3e8.neg;
        local_3b0->fpclass = local_3e8.fpclass;
        local_3b0->prec_elem = local_3e8.prec_elem;
        ::soplex::infinity::__tls_init();
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 10;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems._24_5_ = 0;
        local_3e8.data._M_elems[7]._1_3_ = 0;
        local_3e8.data._M_elems._32_5_ = 0;
        local_3e8.data._M_elems[9]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,(double)local_398);
        *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
        *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
             CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
        *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
             CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
        (enterMax->m_backend).exp = local_3e8.exp;
        (enterMax->m_backend).neg = local_3e8.neg;
        (enterMax->m_backend).fpclass = local_3e8.fpclass;
        (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
        pVVar20 = &(this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left;
        SVar19 = P_ON_LOWER;
      }
      else {
        pnVar7 = (this->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)((long)&pnVar7[lVar26].m_backend.data + 0x20);
        *(undefined8 *)((local_3b0->data)._M_elems + 8) = uVar6;
        pnVar5 = pnVar7 + lVar26;
        uVar32 = (pnVar5->m_backend).data._M_elems[0];
        uVar10 = *(uint *)((long)&(pnVar5->m_backend).data + 4);
        uVar11 = *(uint *)((long)&(pnVar5->m_backend).data + 8);
        uVar12 = *(uint *)((long)&(pnVar5->m_backend).data + 0xc);
        puVar1 = (uint *)((long)&pnVar7[lVar26].m_backend.data + 0x10);
        uVar13 = *(undefined8 *)puVar1;
        uVar14 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((local_3b0->data)._M_elems + 4) = uVar13;
        *(undefined8 *)((local_3b0->data)._M_elems + 6) = uVar14;
        (local_3b0->data)._M_elems[0] = uVar32;
        (local_3b0->data)._M_elems[1] = uVar10;
        (local_3b0->data)._M_elems[2] = uVar11;
        (local_3b0->data)._M_elems[3] = uVar12;
        local_3b0->exp = pnVar7[lVar26].m_backend.exp;
        local_3b0->neg = pnVar7[lVar26].m_backend.neg;
        iVar3 = pnVar7[lVar26].m_backend.prec_elem;
        local_3b0->fpclass = pnVar7[lVar26].m_backend.fpclass;
        local_3b0->prec_elem = iVar3;
        *(undefined8 *)((local_3a0->data)._M_elems + 8) = uVar6;
        *(undefined8 *)((local_3a0->data)._M_elems + 4) = uVar13;
        *(undefined8 *)((local_3a0->data)._M_elems + 6) = uVar14;
        (local_3a0->data)._M_elems[0] = uVar32;
        (local_3a0->data)._M_elems[1] = uVar10;
        (local_3a0->data)._M_elems[2] = uVar11;
        (local_3a0->data)._M_elems[3] = uVar12;
        local_3a0->exp = local_3b0->exp;
        local_3a0->neg = local_3b0->neg;
        iVar3 = local_3b0->prec_elem;
        local_3a0->fpclass = local_3b0->fpclass;
        local_3a0->prec_elem = iVar3;
        ::soplex::infinity::__tls_init();
        pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
        local_3b0 = (cpp_dec_float<50U,_int,_void> *)*pdVar21;
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 10;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems._24_5_ = 0;
        local_3e8.data._M_elems[7]._1_3_ = 0;
        local_3e8.data._M_elems._32_5_ = 0;
        local_3e8.data._M_elems[9]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,(double)local_3b0);
        *(undefined8 *)(local_398->data)._M_elems = local_3e8.data._M_elems._0_8_;
        *(undefined8 *)((local_398->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
        *(undefined8 *)((local_398->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
        *(ulong *)((local_398->data)._M_elems + 6) =
             CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
        *(ulong *)((local_398->data)._M_elems + 8) =
             CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
        local_398->exp = local_3e8.exp;
        local_398->neg = local_3e8.neg;
        local_398->fpclass = local_3e8.fpclass;
        local_398->prec_elem = local_3e8.prec_elem;
        ::soplex::infinity::__tls_init();
        pVVar20 = &(this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right;
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 10;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems._24_5_ = 0;
        local_3e8.data._M_elems[7]._1_3_ = 0;
        local_3e8.data._M_elems._32_5_ = 0;
        local_3e8.data._M_elems[9]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,(double)local_3b0);
        *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
        *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
             CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
        *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
             CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
        (enterMax->m_backend).exp = local_3e8.exp;
        (enterMax->m_backend).neg = local_3e8.neg;
        (enterMax->m_backend).fpclass = local_3e8.fpclass;
        (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
        SVar19 = P_ON_UPPER;
      }
      pnVar5 = (pVVar20->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar13;
      (enterRO->m_backend).exp = pnVar5[lVar26].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = pnVar5[lVar26].m_backend.fpclass;
      (enterRO->m_backend).prec_elem = iVar3;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[local_3a8] = SVar19;
      pcVar27 = &(this->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend;
      pcVar28 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar22 = pcVar27;
      if ((&local_3e8 != pcVar28) && (pcVar22 = pcVar28, &local_3e8 != pcVar27)) {
        uVar6 = *(undefined8 *)((pcVar27->data)._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar27->data)._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar27->data)._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar27->data)._M_elems + 4);
        uVar6 = *(undefined8 *)((pcVar27->data)._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.exp = pcVar27->exp;
        local_3e8.neg = pcVar27->neg;
        local_3e8.fpclass = pcVar27->fpclass;
        local_3e8.prec_elem = pcVar27->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar22)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      pcVar22 = &(this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend;
      pcVar27 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend;
      goto LAB_0026777b;
    case P_ON_LOWER:
      pnVar5 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_398->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_398->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_398->data)._M_elems = uVar6;
      *(undefined8 *)((local_398->data)._M_elems + 2) = uVar13;
      local_398->exp = pnVar5[lVar26].m_backend.exp;
      local_398->neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      local_398->fpclass = pnVar5[lVar26].m_backend.fpclass;
      local_398->prec_elem = iVar3;
      pnVar5 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_3b0->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_3b0->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_3b0->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_3b0->data)._M_elems = uVar6;
      *(undefined8 *)((local_3b0->data)._M_elems + 2) = uVar13;
      local_3b0->exp = pnVar5[lVar26].m_backend.exp;
      local_3b0->neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      local_3b0->fpclass = pnVar5[lVar26].m_backend.fpclass;
      local_3b0->prec_elem = iVar3;
      *(undefined8 *)((local_3a0->data)._M_elems + 8) =
           *(undefined8 *)((local_398->data)._M_elems + 8);
      uVar6 = *(undefined8 *)(local_398->data)._M_elems;
      uVar13 = *(undefined8 *)((local_398->data)._M_elems + 2);
      uVar14 = *(undefined8 *)((local_398->data)._M_elems + 6);
      *(undefined8 *)((local_3a0->data)._M_elems + 4) =
           *(undefined8 *)((local_398->data)._M_elems + 4);
      *(undefined8 *)((local_3a0->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_3a0->data)._M_elems = uVar6;
      *(undefined8 *)((local_3a0->data)._M_elems + 2) = uVar13;
      local_3a0->exp = local_398->exp;
      local_3a0->neg = local_398->neg;
      iVar3 = local_398->prec_elem;
      local_3a0->fpclass = local_398->fpclass;
      local_3a0->prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      if (&local_3e8 == local_398) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3e8,local_3b0);
        if (local_3e8.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite) {
          local_3e8.neg = (bool)(local_3e8.neg ^ 1);
        }
      }
      else {
        if (&local_3e8 != local_3b0) {
          uVar6 = *(undefined8 *)((local_3b0->data)._M_elems + 8);
          local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_3e8.data._M_elems._0_8_ = *(undefined8 *)(local_3b0->data)._M_elems;
          local_3e8.data._M_elems._8_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 2);
          local_3e8.data._M_elems._16_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 4);
          uVar6 = *(undefined8 *)((local_3b0->data)._M_elems + 6);
          local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_3e8.exp = local_3b0->exp;
          local_3e8.neg = local_3b0->neg;
          local_3e8.fpclass = local_3b0->fpclass;
          local_3e8.prec_elem = local_3b0->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3e8,local_398);
      }
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pnVar5 = (this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar13;
      iVar18 = pnVar5[lVar26].m_backend.exp;
      (enterRO->m_backend).exp = iVar18;
      bVar17 = pnVar5[lVar26].m_backend.neg;
      (enterRO->m_backend).neg = bVar17;
      fVar2 = pnVar5[lVar26].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar22 = &enterRO->m_backend;
      if ((&local_3e8 != local_3a0) && (pcVar22 = local_3a0, &local_3e8 != &enterRO->m_backend)) {
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.prec_elem = iVar3;
        local_3e8.fpclass = fVar2;
        local_3e8.exp = iVar18;
        local_3e8.neg = bVar17;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar22)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      ::soplex::infinity::__tls_init();
      pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,-*pdVar21);
      if (((local_3b0->fpclass != cpp_dec_float_NaN) && (local_3e8.fpclass != cpp_dec_float_NaN)) &&
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (local_3b0,&local_3e8), iVar18 < 1)) {
        pSVar23 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data;
        goto LAB_002680af;
      }
      local_2a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 8);
      pnVar29 = &local_2a8;
      local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_3b0->data)._M_elems;
      local_2a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 2);
      local_2a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 4);
      local_2a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 6);
      local_2a8.m_backend.exp = local_3b0->exp;
      local_2a8.m_backend.neg = local_3b0->neg;
      local_2a8.m_backend.fpclass = local_3b0->fpclass;
      local_2a8.m_backend.prec_elem = local_3b0->prec_elem;
      local_2e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_398->data)._M_elems;
      local_2e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_398->data)._M_elems + 2);
      local_2e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_398->data)._M_elems + 4);
      local_2e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_398->data)._M_elems + 6);
      pnVar25 = &local_2e8;
      local_2e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_398->data)._M_elems + 8);
      local_2e8.m_backend.exp = local_398->exp;
      local_2e8.m_backend.neg = local_398->neg;
      local_2e8.m_backend.fpclass = local_398->fpclass;
      local_2e8.m_backend.prec_elem = local_398->prec_elem;
      RVar9 = Tolerances::epsilon((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      uVar31 = SUB84(RVar9,0);
      uVar33 = (undefined4)((ulong)RVar9 >> 0x20);
      pcVar30 = local_328;
      break;
    default:
      puVar24 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_3e8.data._M_elems._0_8_ = local_3e8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3e8,"XENTER03 This should never happen.","");
      *puVar24 = &PTR__SPxException_003af870;
      puVar24[1] = puVar24 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar24 + 1),local_3e8.data._M_elems._0_8_,
                 local_3e8.data._M_elems._0_8_ + local_3e8.data._M_elems._8_8_);
      *puVar24 = &PTR__SPxException_003b0638;
      __cxa_throw(puVar24,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      pnVar5 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_398->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_398->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_398->data)._M_elems = uVar6;
      *(undefined8 *)((local_398->data)._M_elems + 2) = uVar13;
      local_398->exp = pnVar5[lVar26].m_backend.exp;
      local_398->neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      local_398->fpclass = pnVar5[lVar26].m_backend.fpclass;
      local_398->prec_elem = iVar3;
      pnVar5 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      *(undefined8 *)((local_3b0->data)._M_elems + 8) = uVar6;
      uVar13 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar14 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar15 = *(undefined8 *)puVar1;
      uVar16 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_3b0->data)._M_elems + 4) = uVar15;
      *(undefined8 *)((local_3b0->data)._M_elems + 6) = uVar16;
      *(undefined8 *)(local_3b0->data)._M_elems = uVar13;
      *(undefined8 *)((local_3b0->data)._M_elems + 2) = uVar14;
      local_3b0->exp = pnVar5[lVar26].m_backend.exp;
      local_3b0->neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      local_3b0->fpclass = pnVar5[lVar26].m_backend.fpclass;
      local_3b0->prec_elem = iVar3;
      *(undefined8 *)((local_3a0->data)._M_elems + 8) = uVar6;
      *(undefined8 *)((local_3a0->data)._M_elems + 4) = uVar15;
      *(undefined8 *)((local_3a0->data)._M_elems + 6) = uVar16;
      *(undefined8 *)(local_3a0->data)._M_elems = uVar13;
      *(undefined8 *)((local_3a0->data)._M_elems + 2) = uVar14;
      local_3a0->exp = local_3b0->exp;
      local_3a0->neg = local_3b0->neg;
      iVar3 = local_3b0->prec_elem;
      local_3a0->fpclass = local_3b0->fpclass;
      local_3a0->prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      if (&local_3e8 == local_3b0) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3e8,local_398);
        if (local_3e8.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite) {
          local_3e8.neg = (bool)(local_3e8.neg ^ 1);
        }
      }
      else {
        if (&local_3e8 != local_398) {
          uVar6 = *(undefined8 *)((local_398->data)._M_elems + 8);
          local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_3e8.data._M_elems._0_8_ = *(undefined8 *)(local_398->data)._M_elems;
          local_3e8.data._M_elems._8_8_ = *(undefined8 *)((local_398->data)._M_elems + 2);
          local_3e8.data._M_elems._16_8_ = *(undefined8 *)((local_398->data)._M_elems + 4);
          uVar6 = *(undefined8 *)((local_398->data)._M_elems + 6);
          local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_3e8.exp = local_398->exp;
          local_3e8.neg = local_398->neg;
          local_3e8.fpclass = local_398->fpclass;
          local_3e8.prec_elem = local_398->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3e8,local_3b0);
      }
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pnVar5 = (this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar13;
      iVar18 = pnVar5[lVar26].m_backend.exp;
      (enterRO->m_backend).exp = iVar18;
      bVar17 = pnVar5[lVar26].m_backend.neg;
      (enterRO->m_backend).neg = bVar17;
      fVar2 = pnVar5[lVar26].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar22 = &enterRO->m_backend;
      if ((&local_3e8 != local_3a0) && (pcVar22 = local_3a0, &local_3e8 != &enterRO->m_backend)) {
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.prec_elem = iVar3;
        local_3e8.fpclass = fVar2;
        local_3e8.exp = iVar18;
        local_3e8.neg = bVar17;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar22)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      ::soplex::infinity::__tls_init();
      pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,*pdVar21);
      if (((local_398->fpclass != cpp_dec_float_NaN) && (local_3e8.fpclass != cpp_dec_float_NaN)) &&
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (local_398,&local_3e8), -1 < iVar18)) {
        pSVar23 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data;
        goto LAB_00267e67;
      }
      local_1e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 8);
      pnVar29 = &local_1e8;
      local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_3b0->data)._M_elems;
      local_1e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 2);
      local_1e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 4);
      local_1e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 6);
      local_1e8.m_backend.exp = local_3b0->exp;
      local_1e8.m_backend.neg = local_3b0->neg;
      local_1e8.m_backend.fpclass = local_3b0->fpclass;
      local_1e8.m_backend.prec_elem = local_3b0->prec_elem;
      local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_398->data)._M_elems;
      local_228.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_398->data)._M_elems + 2);
      local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_398->data)._M_elems + 4);
      local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_398->data)._M_elems + 6);
      pnVar25 = &local_228;
      local_228.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_398->data)._M_elems + 8);
      local_228.m_backend.exp = local_398->exp;
      local_228.m_backend.neg = local_398->neg;
      local_228.m_backend.fpclass = local_398->fpclass;
      local_228.m_backend.prec_elem = local_398->prec_elem;
      RVar9 = Tolerances::epsilon((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      uVar31 = SUB84(RVar9,0);
      uVar33 = (undefined4)((ulong)RVar9 >> 0x20);
      pcVar30 = local_268;
      break;
    case P_FREE:
      puVar24 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_3e8.data._M_elems._0_8_ = local_3e8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3e8,"XENTER02 This should never happen.","");
      *puVar24 = &PTR__SPxException_003af870;
      puVar24[1] = puVar24 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar24 + 1),local_3e8.data._M_elems._0_8_,
                 local_3e8.data._M_elems._0_8_ + local_3e8.data._M_elems._8_8_);
      *puVar24 = &PTR__SPxException_003b0638;
      __cxa_throw(puVar24,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    *(undefined8 *)(pcVar30 + 0x30) = 0xa00000000;
    *(undefined8 *)pcVar30 = 0;
    *(undefined8 *)(pcVar30 + 8) = 0;
    *(undefined8 *)(pcVar30 + 0x10) = 0;
    *(undefined8 *)(pcVar30 + 0x18) = 0;
    *(undefined8 *)(pcVar30 + 0x1d) = 0;
    *(undefined8 *)(pcVar30 + 0x25) = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (pcVar30,(double)CONCAT44(uVar33,uVar31));
    bVar17 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (pnVar29,pnVar25,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)pcVar30);
    pSVar23 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data;
  }
  else {
    SPxColId::SPxColId((SPxColId *)&local_3e8,(SPxId *)&local_370);
    iVar18 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set,(DataKey *)&local_3e8);
    lVar26 = (long)iVar18;
    *enterStat = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.colstat.data[lVar26];
    if (this->theRep == COLUMN) {
      computePvec((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_3e8,this,iVar18);
      computeTest((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_3e8,this,iVar18);
      *(ulong *)((enterTest->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterTest->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(undefined8 *)(enterTest->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      (enterTest->m_backend).exp = local_3e8.exp;
      (enterTest->m_backend).neg = local_3e8.neg;
      (enterTest->m_backend).fpclass = local_3e8.fpclass;
      (enterTest->m_backend).prec_elem = local_3e8.prec_elem;
      pVVar20 = &this->theTest;
    }
    else {
      pVVar20 = &this->theCoTest;
      pnVar5 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterTest->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = uVar13;
      (enterTest->m_backend).exp = pnVar5[lVar26].m_backend.exp;
      (enterTest->m_backend).neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterTest->m_backend).fpclass = pnVar5[lVar26].m_backend.fpclass;
      (enterTest->m_backend).prec_elem = iVar3;
    }
    local_3a8 = lVar26;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(pVVar20->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend,0);
    switch(*enterStat) {
    case D_FREE:
      ::soplex::infinity::__tls_init();
      pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_388 = *pdVar21;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      uStack_380 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(local_398->data)._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((local_398->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((local_398->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((local_398->data)._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((local_398->data)._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      local_398->exp = local_3e8.exp;
      local_398->neg = local_3e8.neg;
      local_398->fpclass = local_3e8.fpclass;
      local_398->prec_elem = local_3e8.prec_elem;
      ::soplex::infinity::__tls_init();
      uStack_38c = uStack_380._4_4_ ^ 0x80000000;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      local_398 = (cpp_dec_float<50U,_int,_void> *)-local_388;
      uStack_390 = (undefined4)uStack_380;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,-local_388);
      *(undefined8 *)(local_3b0->data)._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((local_3b0->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((local_3b0->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((local_3b0->data)._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((local_3b0->data)._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      local_3b0->exp = local_3e8.exp;
      local_3b0->neg = local_3e8.neg;
      local_3b0->fpclass = local_3e8.fpclass;
      local_3b0->prec_elem = local_3e8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(local_3a0,0);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar13 = *(undefined8 *)puVar1;
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)(enterRO->m_backend).data._M_elems =
           *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar13;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      (enterRO->m_backend).exp = pnVar5[lVar26].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = pnVar5[lVar26].m_backend.fpclass;
      (enterRO->m_backend).prec_elem = iVar3;
      pnVar5 = (this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      if ((((int)uVar6 == 2) || ((enterRO->m_backend).fpclass == cpp_dec_float_NaN)) ||
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&enterPric->m_backend,&enterRO->m_backend), iVar18 < 1)) {
        ::soplex::infinity::__tls_init();
        uVar31 = (undefined4)local_398;
        uVar33 = local_398._4_4_;
      }
      else {
        ::soplex::infinity::__tls_init();
        uVar31 = (undefined4)local_388;
        uVar33 = local_388._4_4_;
      }
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.neg = false;
      local_3e8.exp = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,(double)CONCAT44(uVar33,uVar31));
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pSVar23 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data;
LAB_002672b3:
      pSVar23[local_3a8] = P_FIXED;
      return;
    case D_ON_UPPER:
      pnVar7 = (this->theUCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_398->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar7[lVar26].m_backend.data + 0x20);
      pnVar5 = pnVar7 + lVar26;
      uVar32 = (pnVar5->m_backend).data._M_elems[0];
      uVar10 = *(uint *)((long)&(pnVar5->m_backend).data + 4);
      uVar11 = *(uint *)((long)&(pnVar5->m_backend).data + 8);
      uVar12 = *(uint *)((long)&(pnVar5->m_backend).data + 0xc);
      puVar1 = (uint *)((long)&pnVar7[lVar26].m_backend.data + 0x10);
      uVar6 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_398->data)._M_elems + 6) = uVar6;
      (local_398->data)._M_elems[0] = uVar32;
      (local_398->data)._M_elems[1] = uVar10;
      (local_398->data)._M_elems[2] = uVar11;
      (local_398->data)._M_elems[3] = uVar12;
      local_398->exp = pnVar7[lVar26].m_backend.exp;
      local_398->neg = pnVar7[lVar26].m_backend.neg;
      iVar3 = pnVar7[lVar26].m_backend.prec_elem;
      local_398->fpclass = pnVar7[lVar26].m_backend.fpclass;
      local_398->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      local_388 = -*pdVar21;
      uStack_380 = 0x8000000000000000;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,-*pdVar21);
      *(undefined8 *)(local_3b0->data)._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((local_3b0->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((local_3b0->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((local_3b0->data)._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((local_3b0->data)._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      local_3b0->exp = local_3e8.exp;
      local_3b0->neg = local_3e8.neg;
      local_3b0->fpclass = local_3e8.fpclass;
      local_3b0->prec_elem = local_3e8.prec_elem;
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      *(undefined8 *)((local_3a0->data)._M_elems + 8) =
           *(undefined8 *)((local_398->data)._M_elems + 8);
      uVar6 = *(undefined8 *)(local_398->data)._M_elems;
      uVar13 = *(undefined8 *)((local_398->data)._M_elems + 2);
      uVar14 = *(undefined8 *)((local_398->data)._M_elems + 6);
      *(undefined8 *)((local_3a0->data)._M_elems + 4) =
           *(undefined8 *)((local_398->data)._M_elems + 4);
      *(undefined8 *)((local_3a0->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_3a0->data)._M_elems = uVar6;
      *(undefined8 *)((local_3a0->data)._M_elems + 2) = uVar13;
      local_3a0->exp = local_398->exp;
      local_3a0->neg = local_398->neg;
      iVar3 = local_398->prec_elem;
      local_3a0->fpclass = local_398->fpclass;
      local_3a0->prec_elem = iVar3;
      pnVar5 = (this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar13;
      iVar18 = pnVar5[lVar26].m_backend.exp;
      (enterRO->m_backend).exp = iVar18;
      bVar17 = pnVar5[lVar26].m_backend.neg;
      (enterRO->m_backend).neg = bVar17;
      fVar2 = pnVar5[lVar26].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar22 = &enterRO->m_backend;
      if ((&local_3e8 != local_3a0) && (pcVar22 = local_3a0, &local_3e8 != &enterRO->m_backend)) {
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.prec_elem = iVar3;
        local_3e8.fpclass = fVar2;
        local_3e8.exp = iVar18;
        local_3e8.neg = bVar17;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar22)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      pSVar23 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data;
LAB_00267811:
      pSVar23[local_3a8] = P_ON_LOWER;
      return;
    case D_ON_LOWER:
      pnVar7 = (this->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_3b0->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar7[lVar26].m_backend.data + 0x20);
      pnVar5 = pnVar7 + lVar26;
      uVar32 = (pnVar5->m_backend).data._M_elems[0];
      uVar10 = *(uint *)((long)&(pnVar5->m_backend).data + 4);
      uVar11 = *(uint *)((long)&(pnVar5->m_backend).data + 8);
      uVar12 = *(uint *)((long)&(pnVar5->m_backend).data + 0xc);
      puVar1 = (uint *)((long)&pnVar7[lVar26].m_backend.data + 0x10);
      uVar6 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_3b0->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_3b0->data)._M_elems + 6) = uVar6;
      (local_3b0->data)._M_elems[0] = uVar32;
      (local_3b0->data)._M_elems[1] = uVar10;
      (local_3b0->data)._M_elems[2] = uVar11;
      (local_3b0->data)._M_elems[3] = uVar12;
      local_3b0->exp = pnVar7[lVar26].m_backend.exp;
      local_3b0->neg = pnVar7[lVar26].m_backend.neg;
      iVar3 = pnVar7[lVar26].m_backend.prec_elem;
      local_3b0->fpclass = pnVar7[lVar26].m_backend.fpclass;
      local_3b0->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_388 = *pdVar21;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(local_398->data)._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((local_398->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((local_398->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((local_398->data)._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((local_398->data)._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      local_398->exp = local_3e8.exp;
      local_398->neg = local_3e8.neg;
      local_398->fpclass = local_3e8.fpclass;
      local_398->prec_elem = local_3e8.prec_elem;
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      *(undefined8 *)((local_3a0->data)._M_elems + 8) =
           *(undefined8 *)((local_3b0->data)._M_elems + 8);
      uVar6 = *(undefined8 *)(local_3b0->data)._M_elems;
      uVar13 = *(undefined8 *)((local_3b0->data)._M_elems + 2);
      uVar14 = *(undefined8 *)((local_3b0->data)._M_elems + 6);
      *(undefined8 *)((local_3a0->data)._M_elems + 4) =
           *(undefined8 *)((local_3b0->data)._M_elems + 4);
      *(undefined8 *)((local_3a0->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_3a0->data)._M_elems = uVar6;
      *(undefined8 *)((local_3a0->data)._M_elems + 2) = uVar13;
      local_3a0->exp = local_3b0->exp;
      local_3a0->neg = local_3b0->neg;
      iVar3 = local_3b0->prec_elem;
      local_3a0->fpclass = local_3b0->fpclass;
      local_3a0->prec_elem = iVar3;
      pnVar5 = (this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar13;
      iVar18 = pnVar5[lVar26].m_backend.exp;
      (enterRO->m_backend).exp = iVar18;
      bVar17 = pnVar5[lVar26].m_backend.neg;
      (enterRO->m_backend).neg = bVar17;
      fVar2 = pnVar5[lVar26].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar22 = &enterRO->m_backend;
      if ((&local_3e8 != local_3a0) && (pcVar22 = local_3a0, &local_3e8 != &enterRO->m_backend)) {
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.prec_elem = iVar3;
        local_3e8.fpclass = fVar2;
        local_3e8.exp = iVar18;
        local_3e8.neg = bVar17;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar22)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      pSVar23 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data;
LAB_00267737:
      pSVar23[local_3a8] = P_ON_UPPER;
      return;
    case D_ON_BOTH:
      pnVar5 = (this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      if ((((int)uVar6 == 2) ||
          (pnVar5 = (this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pnVar5[lVar26].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&enterPric->m_backend,&pnVar5[lVar26].m_backend), iVar18 < 1)) {
        pnVar5 = (this->theUCbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
        *(undefined8 *)((local_398->data)._M_elems + 8) = uVar6;
        uVar13 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
        uVar14 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
        uVar15 = *(undefined8 *)puVar1;
        uVar16 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((local_398->data)._M_elems + 4) = uVar15;
        *(undefined8 *)((local_398->data)._M_elems + 6) = uVar16;
        *(undefined8 *)(local_398->data)._M_elems = uVar13;
        *(undefined8 *)((local_398->data)._M_elems + 2) = uVar14;
        local_398->exp = pnVar5[lVar26].m_backend.exp;
        local_398->neg = pnVar5[lVar26].m_backend.neg;
        iVar3 = pnVar5[lVar26].m_backend.prec_elem;
        local_398->fpclass = pnVar5[lVar26].m_backend.fpclass;
        local_398->prec_elem = iVar3;
        *(undefined8 *)((local_3a0->data)._M_elems + 8) = uVar6;
        *(undefined8 *)((local_3a0->data)._M_elems + 4) = uVar15;
        *(undefined8 *)((local_3a0->data)._M_elems + 6) = uVar16;
        *(undefined8 *)(local_3a0->data)._M_elems = uVar13;
        *(undefined8 *)((local_3a0->data)._M_elems + 2) = uVar14;
        local_3a0->exp = local_398->exp;
        local_3a0->neg = local_398->neg;
        iVar3 = local_398->prec_elem;
        local_3a0->fpclass = local_398->fpclass;
        local_3a0->prec_elem = iVar3;
        pnVar7 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
             *(undefined8 *)((long)&pnVar7[lVar26].m_backend.data + 0x20);
        pnVar5 = pnVar7 + lVar26;
        uVar32 = (pnVar5->m_backend).data._M_elems[0];
        uVar10 = *(uint *)((long)&(pnVar5->m_backend).data + 4);
        uVar11 = *(uint *)((long)&(pnVar5->m_backend).data + 8);
        uVar12 = *(uint *)((long)&(pnVar5->m_backend).data + 0xc);
        puVar1 = (uint *)((long)&pnVar7[lVar26].m_backend.data + 0x10);
        uVar6 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
        *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar6;
        (enterRO->m_backend).data._M_elems[0] = uVar32;
        (enterRO->m_backend).data._M_elems[1] = uVar10;
        (enterRO->m_backend).data._M_elems[2] = uVar11;
        (enterRO->m_backend).data._M_elems[3] = uVar12;
        (enterRO->m_backend).exp = pnVar7[lVar26].m_backend.exp;
        (enterRO->m_backend).neg = pnVar7[lVar26].m_backend.neg;
        iVar3 = pnVar7[lVar26].m_backend.prec_elem;
        (enterRO->m_backend).fpclass = pnVar7[lVar26].m_backend.fpclass;
        (enterRO->m_backend).prec_elem = iVar3;
        ::soplex::infinity::__tls_init();
        pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 10;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems._24_5_ = 0;
        local_3e8.data._M_elems[7]._1_3_ = 0;
        local_3e8.data._M_elems._32_5_ = 0;
        local_3e8.data._M_elems[9]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        local_398 = (cpp_dec_float<50U,_int,_void> *)((ulong)*pdVar21 ^ 0x8000000000000000);
        uStack_390 = 0;
        uStack_38c = 0x80000000;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,-*pdVar21);
        *(undefined8 *)(local_3b0->data)._M_elems = local_3e8.data._M_elems._0_8_;
        *(undefined8 *)((local_3b0->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
        *(undefined8 *)((local_3b0->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
        *(ulong *)((local_3b0->data)._M_elems + 6) =
             CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
        *(ulong *)((local_3b0->data)._M_elems + 8) =
             CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
        local_3b0->exp = local_3e8.exp;
        local_3b0->neg = local_3e8.neg;
        local_3b0->fpclass = local_3e8.fpclass;
        local_3b0->prec_elem = local_3e8.prec_elem;
        ::soplex::infinity::__tls_init();
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 10;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems._24_5_ = 0;
        local_3e8.data._M_elems[7]._1_3_ = 0;
        local_3e8.data._M_elems._32_5_ = 0;
        local_3e8.data._M_elems[9]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,(double)local_398);
        *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
        *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
             CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
        *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
             CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
        (enterMax->m_backend).exp = local_3e8.exp;
        (enterMax->m_backend).neg = local_3e8.neg;
        (enterMax->m_backend).fpclass = local_3e8.fpclass;
        (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
        SVar19 = P_ON_LOWER;
      }
      else {
        pnVar7 = (this->theLCbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((local_3b0->data)._M_elems + 8) =
             *(undefined8 *)((long)&pnVar7[lVar26].m_backend.data + 0x20);
        pnVar5 = pnVar7 + lVar26;
        uVar32 = (pnVar5->m_backend).data._M_elems[0];
        uVar10 = *(uint *)((long)&(pnVar5->m_backend).data + 4);
        uVar11 = *(uint *)((long)&(pnVar5->m_backend).data + 8);
        uVar12 = *(uint *)((long)&(pnVar5->m_backend).data + 0xc);
        puVar1 = (uint *)((long)&pnVar7[lVar26].m_backend.data + 0x10);
        uVar6 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((local_3b0->data)._M_elems + 4) = *(undefined8 *)puVar1;
        *(undefined8 *)((local_3b0->data)._M_elems + 6) = uVar6;
        (local_3b0->data)._M_elems[0] = uVar32;
        (local_3b0->data)._M_elems[1] = uVar10;
        (local_3b0->data)._M_elems[2] = uVar11;
        (local_3b0->data)._M_elems[3] = uVar12;
        local_3b0->exp = pnVar7[lVar26].m_backend.exp;
        local_3b0->neg = pnVar7[lVar26].m_backend.neg;
        iVar3 = pnVar7[lVar26].m_backend.prec_elem;
        local_3b0->fpclass = pnVar7[lVar26].m_backend.fpclass;
        local_3b0->prec_elem = iVar3;
        ::soplex::infinity::__tls_init();
        pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
        local_388 = *pdVar21;
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 10;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems._24_5_ = 0;
        local_3e8.data._M_elems[7]._1_3_ = 0;
        local_3e8.data._M_elems._32_5_ = 0;
        local_3e8.data._M_elems[9]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
        *(undefined8 *)(local_398->data)._M_elems = local_3e8.data._M_elems._0_8_;
        *(undefined8 *)((local_398->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
        *(undefined8 *)((local_398->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
        *(ulong *)((local_398->data)._M_elems + 6) =
             CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
        *(ulong *)((local_398->data)._M_elems + 8) =
             CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
        local_398->exp = local_3e8.exp;
        local_398->neg = local_3e8.neg;
        local_398->fpclass = local_3e8.fpclass;
        local_398->prec_elem = local_3e8.prec_elem;
        ::soplex::infinity::__tls_init();
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 10;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems._24_5_ = 0;
        local_3e8.data._M_elems[7]._1_3_ = 0;
        local_3e8.data._M_elems._32_5_ = 0;
        local_3e8.data._M_elems[9]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
        *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
        *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
             CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
        *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
             CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
        (enterMax->m_backend).exp = local_3e8.exp;
        (enterMax->m_backend).neg = local_3e8.neg;
        (enterMax->m_backend).fpclass = local_3e8.fpclass;
        (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
        *(undefined8 *)((local_3a0->data)._M_elems + 8) =
             *(undefined8 *)((local_3b0->data)._M_elems + 8);
        uVar6 = *(undefined8 *)(local_3b0->data)._M_elems;
        uVar13 = *(undefined8 *)((local_3b0->data)._M_elems + 2);
        uVar14 = *(undefined8 *)((local_3b0->data)._M_elems + 6);
        *(undefined8 *)((local_3a0->data)._M_elems + 4) =
             *(undefined8 *)((local_3b0->data)._M_elems + 4);
        *(undefined8 *)((local_3a0->data)._M_elems + 6) = uVar14;
        *(undefined8 *)(local_3a0->data)._M_elems = uVar6;
        *(undefined8 *)((local_3a0->data)._M_elems + 2) = uVar13;
        local_3a0->exp = local_3b0->exp;
        local_3a0->neg = local_3b0->neg;
        iVar3 = local_3b0->prec_elem;
        local_3a0->fpclass = local_3b0->fpclass;
        local_3a0->prec_elem = iVar3;
        pnVar5 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
             *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
        uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
        uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
        uVar14 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
        *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
        *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
        *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar13;
        (enterRO->m_backend).exp = pnVar5[lVar26].m_backend.exp;
        (enterRO->m_backend).neg = pnVar5[lVar26].m_backend.neg;
        iVar3 = pnVar5[lVar26].m_backend.prec_elem;
        (enterRO->m_backend).fpclass = pnVar5[lVar26].m_backend.fpclass;
        (enterRO->m_backend).prec_elem = iVar3;
        SVar19 = P_ON_UPPER;
      }
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[local_3a8] = SVar19;
      pcVar27 = &(this->theLCbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend;
      pcVar28 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar22 = pcVar27;
      if ((&local_3e8 != pcVar28) && (pcVar22 = pcVar28, &local_3e8 != pcVar27)) {
        uVar6 = *(undefined8 *)((pcVar27->data)._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar27->data)._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar27->data)._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar27->data)._M_elems + 4);
        uVar6 = *(undefined8 *)((pcVar27->data)._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.exp = pcVar27->exp;
        local_3e8.neg = pcVar27->neg;
        local_3e8.fpclass = pcVar27->fpclass;
        local_3e8.prec_elem = pcVar27->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar22)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      pcVar22 = &(this->theUCbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend;
      pcVar27 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend;
LAB_0026777b:
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar28 = pcVar22;
      if ((&local_3e8 != pcVar27) && (pcVar28 = pcVar27, &local_3e8 != pcVar22)) {
        uVar6 = *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)&pcVar22->data)->data)._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar22->data)->data)._M_elems;
        local_3e8.data._M_elems._8_8_ =
             *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar22->data)->data)._M_elems + 2)
        ;
        local_3e8.data._M_elems._16_8_ =
             *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar22->data)->data)._M_elems + 4)
        ;
        uVar6 = *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)&pcVar22->data)->data)._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.exp = pcVar22->exp;
        local_3e8.neg = pcVar22->neg;
        local_3e8.fpclass = pcVar22->fpclass;
        local_3e8.prec_elem = pcVar22->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar28)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      return;
    case P_ON_LOWER:
      pnVar5 = (this->theUCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_398->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_398->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_398->data)._M_elems = uVar6;
      *(undefined8 *)((local_398->data)._M_elems + 2) = uVar13;
      local_398->exp = pnVar5[lVar26].m_backend.exp;
      local_398->neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      local_398->fpclass = pnVar5[lVar26].m_backend.fpclass;
      local_398->prec_elem = iVar3;
      pnVar5 = (this->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      *(undefined8 *)((local_3b0->data)._M_elems + 8) = uVar6;
      uVar13 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar14 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar15 = *(undefined8 *)puVar1;
      uVar16 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_3b0->data)._M_elems + 4) = uVar15;
      *(undefined8 *)((local_3b0->data)._M_elems + 6) = uVar16;
      *(undefined8 *)(local_3b0->data)._M_elems = uVar13;
      *(undefined8 *)((local_3b0->data)._M_elems + 2) = uVar14;
      local_3b0->exp = pnVar5[lVar26].m_backend.exp;
      local_3b0->neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      local_3b0->fpclass = pnVar5[lVar26].m_backend.fpclass;
      local_3b0->prec_elem = iVar3;
      *(undefined8 *)((local_3a0->data)._M_elems + 8) = uVar6;
      *(undefined8 *)((local_3a0->data)._M_elems + 4) = uVar15;
      *(undefined8 *)((local_3a0->data)._M_elems + 6) = uVar16;
      *(undefined8 *)(local_3a0->data)._M_elems = uVar13;
      *(undefined8 *)((local_3a0->data)._M_elems + 2) = uVar14;
      local_3a0->exp = local_3b0->exp;
      local_3a0->neg = local_3b0->neg;
      iVar3 = local_3b0->prec_elem;
      local_3a0->fpclass = local_3b0->fpclass;
      local_3a0->prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      if (&local_3e8 == local_3b0) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3e8,local_398);
        if (local_3e8.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite) {
          local_3e8.neg = (bool)(local_3e8.neg ^ 1);
        }
      }
      else {
        if (&local_3e8 != local_398) {
          uVar6 = *(undefined8 *)((local_398->data)._M_elems + 8);
          local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_3e8.data._M_elems._0_8_ = *(undefined8 *)(local_398->data)._M_elems;
          local_3e8.data._M_elems._8_8_ = *(undefined8 *)((local_398->data)._M_elems + 2);
          local_3e8.data._M_elems._16_8_ = *(undefined8 *)((local_398->data)._M_elems + 4);
          uVar6 = *(undefined8 *)((local_398->data)._M_elems + 6);
          local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_3e8.exp = local_398->exp;
          local_3e8.neg = local_398->neg;
          local_3e8.fpclass = local_398->fpclass;
          local_3e8.prec_elem = local_398->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3e8,local_3b0);
      }
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar13;
      (enterRO->m_backend).exp = pnVar5[lVar26].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = pnVar5[lVar26].m_backend.fpclass;
      (enterRO->m_backend).prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar22 = local_3a0;
      if ((&local_3e8 != &enterRO->m_backend) &&
         (pcVar22 = &enterRO->m_backend, &local_3e8 != local_3a0)) {
        uVar6 = *(undefined8 *)((local_3a0->data)._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(local_3a0->data)._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((local_3a0->data)._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((local_3a0->data)._M_elems + 4);
        uVar6 = *(undefined8 *)((local_3a0->data)._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.exp = local_3a0->exp;
        local_3e8.neg = local_3a0->neg;
        local_3e8.fpclass = local_3a0->fpclass;
        local_3e8.prec_elem = local_3a0->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar22)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      ::soplex::infinity::__tls_init();
      pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,*pdVar21);
      if (((local_398->fpclass != cpp_dec_float_NaN) && (local_3e8.fpclass != cpp_dec_float_NaN)) &&
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (local_398,&local_3e8), -1 < iVar18)) {
        pSVar23 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data;
LAB_002680af:
        pSVar23[local_3a8] = D_ON_UPPER;
        return;
      }
      local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 8);
      pnVar29 = &local_128;
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_3b0->data)._M_elems;
      local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 4);
      local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 6);
      local_128.m_backend.exp = local_3b0->exp;
      local_128.m_backend.neg = local_3b0->neg;
      local_128.m_backend.fpclass = local_3b0->fpclass;
      local_128.m_backend.prec_elem = local_3b0->prec_elem;
      local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_398->data)._M_elems;
      local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_398->data)._M_elems + 2);
      local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_398->data)._M_elems + 4);
      local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_398->data)._M_elems + 6);
      pnVar25 = &local_168;
      local_168.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_398->data)._M_elems + 8);
      local_168.m_backend.exp = local_398->exp;
      local_168.m_backend.neg = local_398->neg;
      local_168.m_backend.fpclass = local_398->fpclass;
      local_168.m_backend.prec_elem = local_398->prec_elem;
      RVar9 = Tolerances::epsilon((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      uVar31 = SUB84(RVar9,0);
      uVar33 = (undefined4)((ulong)RVar9 >> 0x20);
      pcVar30 = local_1a8;
      break;
    default:
      puVar24 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_3e8.data._M_elems._0_8_ = local_3e8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3e8,"XENTER01 This should never happen.","");
      *puVar24 = &PTR__SPxException_003af870;
      puVar24[1] = puVar24 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar24 + 1),local_3e8.data._M_elems._0_8_,
                 local_3e8.data._M_elems._0_8_ + local_3e8.data._M_elems._8_8_);
      *puVar24 = &PTR__SPxException_003b0638;
      __cxa_throw(puVar24,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      pnVar5 = (this->theUCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_398->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_398->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_398->data)._M_elems = uVar6;
      *(undefined8 *)((local_398->data)._M_elems + 2) = uVar13;
      local_398->exp = pnVar5[lVar26].m_backend.exp;
      local_398->neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      local_398->fpclass = pnVar5[lVar26].m_backend.fpclass;
      local_398->prec_elem = iVar3;
      pnVar5 = (this->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_3b0->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_3b0->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_3b0->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_3b0->data)._M_elems = uVar6;
      *(undefined8 *)((local_3b0->data)._M_elems + 2) = uVar13;
      local_3b0->exp = pnVar5[lVar26].m_backend.exp;
      local_3b0->neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      local_3b0->fpclass = pnVar5[lVar26].m_backend.fpclass;
      local_3b0->prec_elem = iVar3;
      *(undefined8 *)((local_3a0->data)._M_elems + 8) =
           *(undefined8 *)((local_398->data)._M_elems + 8);
      uVar6 = *(undefined8 *)(local_398->data)._M_elems;
      uVar13 = *(undefined8 *)((local_398->data)._M_elems + 2);
      uVar14 = *(undefined8 *)((local_398->data)._M_elems + 6);
      *(undefined8 *)((local_3a0->data)._M_elems + 4) =
           *(undefined8 *)((local_398->data)._M_elems + 4);
      *(undefined8 *)((local_3a0->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_3a0->data)._M_elems = uVar6;
      *(undefined8 *)((local_3a0->data)._M_elems + 2) = uVar13;
      local_3a0->exp = local_398->exp;
      local_3a0->neg = local_398->neg;
      iVar3 = local_398->prec_elem;
      local_3a0->fpclass = local_398->fpclass;
      local_3a0->prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      if (&local_3e8 == local_398) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3e8,local_3b0);
        if (local_3e8.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite) {
          local_3e8.neg = (bool)(local_3e8.neg ^ 1);
        }
      }
      else {
        if (&local_3e8 != local_3b0) {
          uVar6 = *(undefined8 *)((local_3b0->data)._M_elems + 8);
          local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_3e8.data._M_elems._0_8_ = *(undefined8 *)(local_3b0->data)._M_elems;
          local_3e8.data._M_elems._8_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 2);
          local_3e8.data._M_elems._16_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 4);
          uVar6 = *(undefined8 *)((local_3b0->data)._M_elems + 6);
          local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_3e8.exp = local_3b0->exp;
          local_3e8.neg = local_3b0->neg;
          local_3e8.fpclass = local_3b0->fpclass;
          local_3e8.prec_elem = local_3b0->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3e8,local_398);
      }
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar13;
      (enterRO->m_backend).exp = pnVar5[lVar26].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = pnVar5[lVar26].m_backend.fpclass;
      (enterRO->m_backend).prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar22 = local_3a0;
      if ((&local_3e8 != &enterRO->m_backend) &&
         (pcVar22 = &enterRO->m_backend, &local_3e8 != local_3a0)) {
        uVar6 = *(undefined8 *)((local_3a0->data)._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(local_3a0->data)._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((local_3a0->data)._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((local_3a0->data)._M_elems + 4);
        uVar6 = *(undefined8 *)((local_3a0->data)._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.exp = local_3a0->exp;
        local_3e8.neg = local_3a0->neg;
        local_3e8.fpclass = local_3a0->fpclass;
        local_3e8.prec_elem = local_3a0->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar22)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      ::soplex::infinity::__tls_init();
      pdVar21 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,-*pdVar21);
      if (((local_3b0->fpclass != cpp_dec_float_NaN) && (local_3e8.fpclass != cpp_dec_float_NaN)) &&
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (local_3b0,&local_3e8), iVar18 < 1)) {
        pSVar23 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data;
LAB_00267e67:
        pSVar23[local_3a8] = D_ON_LOWER;
        return;
      }
      local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 8);
      pnVar29 = &local_68;
      local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_3b0->data)._M_elems;
      local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 2);
      local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 4);
      local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_3b0->data)._M_elems + 6);
      local_68.m_backend.exp = local_3b0->exp;
      local_68.m_backend.neg = local_3b0->neg;
      local_68.m_backend.fpclass = local_3b0->fpclass;
      local_68.m_backend.prec_elem = local_3b0->prec_elem;
      local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_398->data)._M_elems;
      local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_398->data)._M_elems + 2);
      local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_398->data)._M_elems + 4);
      local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_398->data)._M_elems + 6);
      pnVar25 = &local_a8;
      local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_398->data)._M_elems + 8);
      local_a8.m_backend.exp = local_398->exp;
      local_a8.m_backend.neg = local_398->neg;
      local_a8.m_backend.fpclass = local_398->fpclass;
      local_a8.m_backend.prec_elem = local_398->prec_elem;
      RVar9 = Tolerances::epsilon((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      uVar31 = SUB84(RVar9,0);
      uVar33 = (undefined4)((ulong)RVar9 >> 0x20);
      pcVar30 = local_e8;
      break;
    case P_FREE:
      pnVar5 = (this->theUCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_398->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_398->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_398->data)._M_elems = uVar6;
      *(undefined8 *)((local_398->data)._M_elems + 2) = uVar13;
      local_398->exp = pnVar5[lVar26].m_backend.exp;
      local_398->neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      local_398->fpclass = pnVar5[lVar26].m_backend.fpclass;
      local_398->prec_elem = iVar3;
      pnVar5 = (this->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_3b0->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_3b0->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_3b0->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(local_3b0->data)._M_elems = uVar6;
      *(undefined8 *)((local_3b0->data)._M_elems + 2) = uVar13;
      local_3b0->exp = pnVar5[lVar26].m_backend.exp;
      local_3b0->neg = pnVar5[lVar26].m_backend.neg;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      local_3b0->fpclass = pnVar5[lVar26].m_backend.fpclass;
      local_3b0->prec_elem = iVar3;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(local_3a0,0);
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar26].m_backend;
      uVar13 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend + 8);
      uVar14 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar26) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar13;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar26) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar26) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar26) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar26].m_backend.data + 0x10);
      uVar13 = *(undefined8 *)puVar1;
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)(enterRO->m_backend).data._M_elems =
           *(undefined8 *)&pnVar5[lVar26].m_backend.data;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar13;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar14;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar26].m_backend.data + 0x20);
      iVar18 = pnVar5[lVar26].m_backend.exp;
      (enterRO->m_backend).exp = iVar18;
      bVar17 = pnVar5[lVar26].m_backend.neg;
      (enterRO->m_backend).neg = bVar17;
      fVar2 = pnVar5[lVar26].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[lVar26].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[local_3a8] = D_UNDEFINED;
      local_368.fpclass = cpp_dec_float_finite;
      local_368.prec_elem = 10;
      local_368.data._M_elems[0] = 0;
      local_368.data._M_elems[1] = 0;
      local_368.data._M_elems[2] = 0;
      local_368.data._M_elems[3] = 0;
      local_368.data._M_elems[4] = 0;
      local_368.data._M_elems[5] = 0;
      local_368.data._M_elems._24_5_ = 0;
      local_368.data._M_elems[7]._1_3_ = 0;
      local_368.data._M_elems._32_5_ = 0;
      local_368.data._M_elems[9]._1_3_ = 0;
      local_368.exp = 0;
      local_368.neg = false;
      if (&local_368 == &enterPric->m_backend) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_368,&enterRO->m_backend);
        if (local_368.data._M_elems[0] != 0 || local_368.fpclass != cpp_dec_float_finite) {
          local_368.neg = (bool)(local_368.neg ^ 1);
        }
      }
      else {
        if (&local_368 != &enterRO->m_backend) {
          uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
          local_368.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_368.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_368.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
          local_368.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
          local_368.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
          uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
          local_368.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_368.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_368.prec_elem = iVar3;
          local_368.fpclass = fVar2;
          local_368.exp = iVar18;
          local_368.neg = bVar17;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_368,&enterPric->m_backend);
      }
      if (local_368.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_3e8,0,(type *)0x0);
        iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_368,&local_3e8);
        if (0 < iVar18) {
          ::soplex::infinity::__tls_init();
          puVar24 = (undefined8 *)__tls_get_addr(&PTR_003b6b60);
          uVar31 = (undefined4)*puVar24;
          uVar32 = (uint)((ulong)*puVar24 >> 0x20);
          goto LAB_0026760a;
        }
      }
      ::soplex::infinity::__tls_init();
      puVar24 = (undefined8 *)__tls_get_addr(&PTR_003b6b60);
      uVar31 = (undefined4)*puVar24;
      uVar32 = (uint)((ulong)*puVar24 >> 0x20) ^ 0x80000000;
LAB_0026760a:
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,(double)CONCAT44(uVar32,uVar31));
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      return;
    }
    *(undefined8 *)(pcVar30 + 0x30) = 0xa00000000;
    *(undefined8 *)pcVar30 = 0;
    *(undefined8 *)(pcVar30 + 8) = 0;
    *(undefined8 *)(pcVar30 + 0x10) = 0;
    *(undefined8 *)(pcVar30 + 0x18) = 0;
    *(undefined8 *)(pcVar30 + 0x1d) = 0;
    *(undefined8 *)(pcVar30 + 0x25) = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (pcVar30,(double)CONCAT44(uVar33,uVar31));
    bVar17 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (pnVar29,pnVar25,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)pcVar30);
    pSVar23 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
  }
  if (bVar17 == false) {
    pSVar23[local_3a8] = D_ON_BOTH;
  }
  else {
    pSVar23[local_3a8] = D_FREE;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::getEnterVals
(
   SPxId enterId,
   R& enterTest,
   R& enterUB,
   R& enterLB,
   R& enterVal,
   R& enterMax,
   R& enterPric,
   typename SPxBasisBase<R>::Desc::Status& enterStat,
   R& enterRO,
   StableSum<R>& objChange
)
{
   int enterIdx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(enterId.isSPxColId())
   {
      enterIdx = this->number(SPxColId(enterId));
      enterStat = ds.colStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == COLUMN)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterLB <= R(-infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterUB >= R(infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         enterMax = (enterRO - enterPric > 0) ? R(infinity) : R(-infinity);
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theUCbound[enterIdx] < R(infinity));
         enterUB = theUCbound[enterIdx];
         enterLB = R(-infinity);
         enterMax = R(-infinity);
         enterVal = enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::lower(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLCbound[enterIdx] > R(-infinity));
         enterLB = theLCbound[enterIdx];
         enterUB = R(infinity);
         enterMax = R(infinity);
         enterVal = enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::upper(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(SPxLPBase<R>::lower(enterIdx) == SPxLPBase<R>::upper(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterRO = SPxLPBase<R>::upper(enterIdx);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > enterRO)
            enterMax = R(infinity);
         else
            enterMax = R(-infinity);

         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > SPxLPBase<R>::upper(enterIdx))
         {
            enterLB = theLCbound[enterIdx];
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterVal = enterLB;
            enterRO = SPxLPBase<R>::upper(enterIdx);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theUCbound[enterIdx];
            enterVal = enterUB;
            enterRO = SPxLPBase<R>::lower(enterIdx);
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLCbound[enterIdx] * SPxLPBase<R>::upper(enterIdx);
         objChange -= theUCbound[enterIdx] * SPxLPBase<R>::lower(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER01 This should never happen.");
      }

      SPxOut::debug(this, "DENTER03 SPxSolverBase::getEnterVals() : col {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.colStatus(enterIdx), objChange);
   }

   else
   {
      assert(enterId.isSPxRowId());
      enterIdx = this->number(SPxRowId(enterId));
      enterStat = ds.rowStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == ROW)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterUB >= R(infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterLB <= R(-infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XENTER02 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER99 ERROR: not yet debugged!" << std::endl;)
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theURbound[enterIdx] < R(infinity));
         enterUB = theURbound[enterIdx];
         enterLB = R(-infinity);
         enterVal = enterUB;
         enterMax = R(-infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->lhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLRbound[enterIdx] > R(-infinity));
         enterLB = theLRbound[enterIdx];
         enterUB = R(infinity);
         enterVal = enterLB;
         enterMax = R(infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(this->rhs(enterIdx) == this->lhs(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         enterMax = (enterPric > enterRO) ? R(infinity) : R(-infinity);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*thePvec)[enterIdx];

         if(enterPric > this->rhs(enterIdx))
         {
            enterLB = theLRbound[enterIdx];
            enterVal = enterLB;
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterRO = this->rhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theURbound[enterIdx];
            enterVal = enterUB;
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            enterRO = this->lhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLRbound[enterIdx] * this->rhs(enterIdx);
         objChange -= theURbound[enterIdx] * this->lhs(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER03 This should never happen.");
      }

      SPxOut::debug(this, "DENTER05 SPxSolverBase::getEnterVals() : row {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.rowStatus(enterIdx), objChange);
   }
}